

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_handle_message(ptls_t *tls,ptls_buffer_t *sendbuf,size_t *epoch_offsets,size_t in_epoch,
                       void *input,size_t inlen,ptls_handshake_properties_t *properties)

{
  ptls_private_key_method_t *ppVar1;
  int iVar2;
  size_t sVar3;
  st_ptls_raw_message_emitter_t emitter;
  undefined1 local_68 [24];
  ptls_message_emitter_t local_50;
  undefined8 local_28;
  size_t *local_20;
  
  local_50.enc = &(tls->traffic_protection).enc;
  local_50.record_header_length = 0;
  local_50.begin_message = begin_raw_message;
  local_50.commit_message = commit_raw_message;
  local_28 = 0xffffffffffffffff;
  local_68[0] = 0x16;
  local_68._2_2_ = 0;
  local_68._8_8_ = inlen;
  local_68._16_8_ = input;
  local_50.buf = sendbuf;
  local_20 = epoch_offsets;
  if (input == (void *)0x0) {
    iVar2 = send_client_hello(tls,(ptls_message_emitter_t *)(local_68 + 0x18),properties,
                              (ptls_iovec_t *)0x0);
  }
  else {
    sVar3 = ptls_get_read_epoch(tls);
    iVar2 = 10;
    if (sVar3 == in_epoch) {
      ppVar1 = tls->ctx->private_key_method;
      tls->ctx->private_key_method = (ptls_private_key_method_t *)0x0;
      iVar2 = handle_handshake_record
                        (tls,(_func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
                              *)(local_68 + 0x18),(ptls_message_emitter_t *)local_68,
                         (st_ptls_record_t *)properties,(ptls_handshake_properties_t *)input);
      tls->ctx->private_key_method = ppVar1;
    }
  }
  return iVar2;
}

Assistant:

int ptls_handle_message(ptls_t *tls, ptls_buffer_t *sendbuf, size_t epoch_offsets[5], size_t in_epoch, const void *input,
                        size_t inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_raw_message_emitter_t emitter = {
        {sendbuf, &tls->traffic_protection.enc, 0, begin_raw_message, commit_raw_message}, SIZE_MAX, epoch_offsets};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0, inlen, input};

    if (input == NULL)
        return send_client_hello(tls, &emitter.super, properties, NULL);

    if (ptls_get_read_epoch(tls) != in_epoch)
        return PTLS_ALERT_UNEXPECTED_MESSAGE;

    /* This is a back-door so do not handle private keys here.  */
    int rc;
    ptls_private_key_method_t *method = tls->ctx->private_key_method;
    tls->ctx->private_key_method = NULL;
    rc = handle_handshake_record(tls, handle_handshake_message, &emitter.super, &rec, properties);
    tls->ctx->private_key_method = method;
    return rc;
}